

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O1

char * sam_hdr_find_line(SAM_hdr *hdr,char *type,char *ID_key,char *ID_value)

{
  byte bVar1;
  int iVar2;
  SAM_hdr_type *pSVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  SAM_hdr_tag *pSVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  char *local_50;
  
  pSVar3 = sam_hdr_find(hdr,type,ID_key,ID_value);
  if (pSVar3 == (SAM_hdr_type *)0x0) {
    return (char *)0x0;
  }
  uVar11 = 1;
  pcVar4 = (char *)malloc(1);
  if (pcVar4 == (char *)0x0) {
    local_50 = (char *)0x0;
  }
  else {
    *pcVar4 = '@';
    local_50 = pcVar4;
  }
  uVar10 = (ulong)(pcVar4 != (char *)0x0);
  sVar5 = strlen(type);
  iVar2 = (int)sVar5;
  uVar7 = (long)iVar2 + uVar10;
  uVar6 = uVar7 + 1;
  pcVar8 = local_50;
  if (uVar6 != 0) {
    uVar6 = uVar6 >> 1 | uVar6;
    uVar6 = uVar6 >> 2 | uVar6;
    uVar6 = uVar6 >> 4 | uVar6;
    uVar6 = uVar6 >> 8 | uVar6;
    uVar11 = (uVar6 >> 0x10 | uVar6) + 1;
    pcVar8 = (char *)realloc(local_50,uVar11);
    if (pcVar8 == (char *)0x0) {
      bVar12 = true;
      goto LAB_0013a468;
    }
  }
  local_50 = pcVar8;
  memcpy(local_50 + uVar10,type,(long)iVar2);
  local_50[uVar7] = '\0';
  bVar12 = iVar2 == -1;
  uVar10 = uVar7;
LAB_0013a468:
  bVar12 = (bool)(pcVar4 == (char *)0x0 | bVar12);
  pSVar9 = pSVar3->tag;
  do {
    if (pSVar9 == (SAM_hdr_tag *)0x0) {
      if (bVar12) {
        if (local_50 != (char *)0x0) {
          free(local_50);
        }
        return (char *)0x0;
      }
      return local_50;
    }
    pcVar4 = local_50;
    if (uVar11 < uVar10 + 1) {
      uVar11 = uVar10 >> 1 | uVar10;
      uVar11 = uVar11 >> 2 | uVar11;
      uVar11 = uVar11 >> 4 | uVar11;
      uVar11 = uVar11 >> 8 | uVar11;
      uVar11 = (uVar11 >> 0x10 | uVar11) + 1;
      pcVar4 = (char *)realloc(local_50,uVar11);
      if (pcVar4 != (char *)0x0) goto LAB_0013a4ea;
      bVar1 = 1;
    }
    else {
LAB_0013a4ea:
      pcVar4[uVar10] = '\t';
      bVar1 = 0;
      uVar10 = uVar10 + 1;
      local_50 = pcVar4;
    }
    pcVar4 = pSVar9->str;
    iVar2 = pSVar9->len;
    sVar5 = (size_t)iVar2;
    uVar7 = uVar10 + sVar5 + 1;
    pcVar8 = local_50;
    if (uVar7 < uVar11) {
LAB_0013a561:
      memcpy(pcVar8 + uVar10,pcVar4,sVar5);
      uVar10 = uVar10 + sVar5;
      pcVar8[uVar10] = '\0';
      bVar13 = iVar2 == -1;
      local_50 = pcVar8;
    }
    else {
      uVar7 = uVar7 >> 1 | uVar7;
      uVar7 = uVar7 >> 2 | uVar7;
      uVar7 = uVar7 >> 4 | uVar7;
      uVar7 = uVar7 >> 8 | uVar7;
      uVar11 = (uVar7 >> 0x10 | uVar7) + 1;
      pcVar8 = (char *)realloc(local_50,uVar11);
      if (pcVar8 != (char *)0x0) goto LAB_0013a561;
      bVar13 = true;
    }
    bVar12 = (bool)(bVar12 | bVar1 | bVar13);
    pSVar9 = pSVar9->next;
  } while( true );
}

Assistant:

char *sam_hdr_find_line(SAM_hdr *hdr, char *type,
			char *ID_key, char *ID_value) {
    SAM_hdr_type *ty = sam_hdr_find(hdr, type, ID_key, ID_value);
    kstring_t ks = KS_INITIALIZER;
    SAM_hdr_tag *tag;
    int r = 0;

    if (!ty)
	return NULL;

    // Paste together the line from the hashed copy
    r |= (kputc_('@', &ks) == EOF);
    r |= (kputs(type, &ks) == EOF);
    for (tag = ty->tag; tag; tag = tag->next) {
	r |= (kputc_('\t', &ks) == EOF);
	r |= (kputsn(tag->str, tag->len, &ks) == EOF);
    }

    if (r) {
	KS_FREE(&ks);
	return NULL;
    }

    return ks_str(&ks);
}